

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O3

void idct32_low16_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  long lVar31;
  int iVar32;
  int iVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  __m256i clamp_lo;
  __m256i clamp_hi;
  __m256i local_4a0;
  __m256i local_480;
  __m256i local_460;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  lVar31 = (long)bit * 0x100;
  iVar17 = -*(int *)((long)vert_filter_length_chroma + lVar31 + 0x248);
  iVar18 = -*(int *)((long)vert_filter_length_chroma + lVar31 + 0x208);
  iVar19 = -*(int *)((long)vert_filter_length_chroma + lVar31 + 0x228);
  iVar20 = -*(int *)((long)vert_filter_length_chroma + lVar31 + 0x1e8);
  iVar21 = -*(int *)((long)vert_filter_length_chroma + lVar31 + 0x230);
  iVar22 = -*(int *)((long)vert_filter_length_chroma + lVar31 + 0x1f0);
  iVar2 = *(int *)((long)vert_filter_length_chroma + lVar31 + 0x240);
  iVar3 = *(int *)((long)vert_filter_length_chroma + lVar31 + 0x1c0);
  iVar4 = *(int *)((long)vert_filter_length_chroma + lVar31 + 0x200);
  iVar5 = *(int *)((long)vert_filter_length_chroma + lVar31 + 0x180);
  iVar29 = -iVar4;
  iVar23 = -iVar5;
  iVar32 = -iVar2;
  iVar24 = -iVar3;
  iVar6 = *(int *)((long)vert_filter_length_chroma + lVar31 + 0x1e0);
  iVar25 = -iVar6;
  iVar7 = *(int *)((long)vert_filter_length_chroma + lVar31 + 0x220);
  iVar26 = -iVar7;
  iVar33 = 1 << ((char)bit - 1U & 0x1f);
  iVar8 = *(int *)((long)vert_filter_length_chroma + lVar31 + 0x1a0);
  iVar27 = -iVar8;
  iVar30 = bd + 6 + (uint)(do_cols == 0) * 2;
  iVar28 = 0x8000;
  if (0xf < iVar30) {
    iVar28 = 1 << ((char)iVar30 - 1U & 0x1f);
  }
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar31 + 600);
  auVar50._4_4_ = uVar1;
  auVar50._0_4_ = uVar1;
  auVar50._8_4_ = uVar1;
  auVar50._12_4_ = uVar1;
  auVar50._16_4_ = uVar1;
  auVar50._20_4_ = uVar1;
  auVar50._24_4_ = uVar1;
  auVar50._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar31 + 0x1d8);
  auVar53._4_4_ = uVar1;
  auVar53._0_4_ = uVar1;
  auVar53._8_4_ = uVar1;
  auVar53._12_4_ = uVar1;
  auVar53._16_4_ = uVar1;
  auVar53._20_4_ = uVar1;
  auVar53._24_4_ = uVar1;
  auVar53._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar31 + 0x218);
  auVar35._4_4_ = uVar1;
  auVar35._0_4_ = uVar1;
  auVar35._8_4_ = uVar1;
  auVar35._12_4_ = uVar1;
  auVar35._16_4_ = uVar1;
  auVar35._20_4_ = uVar1;
  auVar35._24_4_ = uVar1;
  auVar35._28_4_ = uVar1;
  iVar30 = -iVar28;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar31 + 0x1a8);
  auVar56._4_4_ = uVar1;
  auVar56._0_4_ = uVar1;
  auVar56._8_4_ = uVar1;
  auVar56._12_4_ = uVar1;
  auVar56._16_4_ = uVar1;
  auVar56._20_4_ = uVar1;
  auVar56._24_4_ = uVar1;
  auVar56._28_4_ = uVar1;
  iVar28 = iVar28 + -1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar31 + 0x168);
  auVar59._4_4_ = uVar1;
  auVar59._0_4_ = uVar1;
  auVar59._8_4_ = uVar1;
  auVar59._12_4_ = uVar1;
  auVar59._16_4_ = uVar1;
  auVar59._20_4_ = uVar1;
  auVar59._24_4_ = uVar1;
  auVar59._28_4_ = uVar1;
  auVar61._4_4_ = iVar20;
  auVar61._0_4_ = iVar20;
  auVar61._8_4_ = iVar20;
  auVar61._12_4_ = iVar20;
  auVar61._16_4_ = iVar20;
  auVar61._20_4_ = iVar20;
  auVar61._24_4_ = iVar20;
  auVar61._28_4_ = iVar20;
  local_4a0[0]._4_4_ = iVar30;
  local_4a0[0]._0_4_ = iVar30;
  local_4a0[1]._0_4_ = iVar30;
  local_4a0[1]._4_4_ = iVar30;
  local_4a0[2]._0_4_ = iVar30;
  local_4a0[2]._4_4_ = iVar30;
  local_4a0[3]._0_4_ = iVar30;
  local_4a0[3]._4_4_ = iVar30;
  local_480[0]._4_4_ = iVar28;
  local_480[0]._0_4_ = iVar28;
  local_480[1]._0_4_ = iVar28;
  local_480[1]._4_4_ = iVar28;
  local_480[2]._0_4_ = iVar28;
  local_480[2]._4_4_ = iVar28;
  local_480[3]._0_4_ = iVar28;
  local_480[3]._4_4_ = iVar28;
  auVar9 = vpmulld_avx2(auVar59,(undefined1  [32])in[1]);
  auVar50 = vpmulld_avx2(auVar50,(undefined1  [32])in[1]);
  auVar59 = vpmulld_avx2(auVar61,(undefined1  [32])in[0xf]);
  auVar61 = vpmulld_avx2(auVar53,(undefined1  [32])in[0xf]);
  auVar56 = vpmulld_avx2(auVar56,(undefined1  [32])in[9]);
  auVar35 = vpmulld_avx2(auVar35,(undefined1  [32])in[9]);
  auVar36._4_4_ = iVar19;
  auVar36._0_4_ = iVar19;
  auVar36._8_4_ = iVar19;
  auVar36._12_4_ = iVar19;
  auVar36._16_4_ = iVar19;
  auVar36._20_4_ = iVar19;
  auVar36._24_4_ = iVar19;
  auVar36._28_4_ = iVar19;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar31 + 0x198);
  auVar54._4_4_ = uVar1;
  auVar54._0_4_ = uVar1;
  auVar54._8_4_ = uVar1;
  auVar54._12_4_ = uVar1;
  auVar54._16_4_ = uVar1;
  auVar54._20_4_ = uVar1;
  auVar54._24_4_ = uVar1;
  auVar54._28_4_ = uVar1;
  auVar36 = vpmulld_avx2(auVar36,(undefined1  [32])in[7]);
  auVar54 = vpmulld_avx2(auVar54,(undefined1  [32])in[7]);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar31 + 0x188);
  auVar37._4_4_ = uVar1;
  auVar37._0_4_ = uVar1;
  auVar37._8_4_ = uVar1;
  auVar37._12_4_ = uVar1;
  auVar37._16_4_ = uVar1;
  auVar37._20_4_ = uVar1;
  auVar37._24_4_ = uVar1;
  auVar37._28_4_ = uVar1;
  auVar53 = vpmulld_avx2(auVar37,(undefined1  [32])in[5]);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar31 + 0x238);
  auVar38._4_4_ = uVar1;
  auVar38._0_4_ = uVar1;
  auVar38._8_4_ = uVar1;
  auVar38._12_4_ = uVar1;
  auVar38._16_4_ = uVar1;
  auVar38._20_4_ = uVar1;
  auVar38._24_4_ = uVar1;
  auVar38._28_4_ = uVar1;
  auVar37 = vpmulld_avx2(auVar38,(undefined1  [32])in[5]);
  auVar39._4_4_ = iVar18;
  auVar39._0_4_ = iVar18;
  auVar39._8_4_ = iVar18;
  auVar39._12_4_ = iVar18;
  auVar39._16_4_ = iVar18;
  auVar39._20_4_ = iVar18;
  auVar39._24_4_ = iVar18;
  auVar39._28_4_ = iVar18;
  auVar38 = vpmulld_avx2(auVar39,(undefined1  [32])in[0xb]);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar31 + 0x1b8);
  auVar40._4_4_ = uVar1;
  auVar40._0_4_ = uVar1;
  auVar40._8_4_ = uVar1;
  auVar40._12_4_ = uVar1;
  auVar40._16_4_ = uVar1;
  auVar40._20_4_ = uVar1;
  auVar40._24_4_ = uVar1;
  auVar40._28_4_ = uVar1;
  auVar39 = vpmulld_avx2(auVar40,(undefined1  [32])in[0xb]);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar31 + 0x1c8);
  auVar41._4_4_ = uVar1;
  auVar41._0_4_ = uVar1;
  auVar41._8_4_ = uVar1;
  auVar41._12_4_ = uVar1;
  auVar41._16_4_ = uVar1;
  auVar41._20_4_ = uVar1;
  auVar41._24_4_ = uVar1;
  auVar41._28_4_ = uVar1;
  auVar40 = vpmulld_avx2(auVar41,(undefined1  [32])in[0xd]);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar31 + 0x1f8);
  auVar42._4_4_ = uVar1;
  auVar42._0_4_ = uVar1;
  auVar42._8_4_ = uVar1;
  auVar42._12_4_ = uVar1;
  auVar42._16_4_ = uVar1;
  auVar42._20_4_ = uVar1;
  auVar42._24_4_ = uVar1;
  auVar42._28_4_ = uVar1;
  auVar41 = vpmulld_avx2(auVar42,(undefined1  [32])in[0xd]);
  auVar43._4_4_ = iVar17;
  auVar43._0_4_ = iVar17;
  auVar43._8_4_ = iVar17;
  auVar43._12_4_ = iVar17;
  auVar43._16_4_ = iVar17;
  auVar43._20_4_ = iVar17;
  auVar43._24_4_ = iVar17;
  auVar43._28_4_ = iVar17;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar31 + 0x178);
  auVar58._4_4_ = uVar1;
  auVar58._0_4_ = uVar1;
  auVar58._8_4_ = uVar1;
  auVar58._12_4_ = uVar1;
  auVar58._16_4_ = uVar1;
  auVar58._20_4_ = uVar1;
  auVar58._24_4_ = uVar1;
  auVar58._28_4_ = uVar1;
  auVar42 = vpmulld_avx2(auVar43,(undefined1  [32])in[3]);
  auVar43 = vpmulld_avx2(auVar58,(undefined1  [32])in[3]);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar31 + 0x170);
  auVar44._4_4_ = uVar1;
  auVar44._0_4_ = uVar1;
  auVar44._8_4_ = uVar1;
  auVar44._12_4_ = uVar1;
  auVar44._16_4_ = uVar1;
  auVar44._20_4_ = uVar1;
  auVar44._24_4_ = uVar1;
  auVar44._28_4_ = uVar1;
  auVar44 = vpmulld_avx2(auVar44,(undefined1  [32])in[2]);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar31 + 0x250);
  auVar45._4_4_ = uVar1;
  auVar45._0_4_ = uVar1;
  auVar45._8_4_ = uVar1;
  auVar45._12_4_ = uVar1;
  auVar45._16_4_ = uVar1;
  auVar45._20_4_ = uVar1;
  auVar45._24_4_ = uVar1;
  auVar45._28_4_ = uVar1;
  auVar45 = vpmulld_avx2(auVar45,(undefined1  [32])in[2]);
  auVar46._4_4_ = iVar22;
  auVar46._0_4_ = iVar22;
  auVar46._8_4_ = iVar22;
  auVar46._12_4_ = iVar22;
  auVar46._16_4_ = iVar22;
  auVar46._20_4_ = iVar22;
  auVar46._24_4_ = iVar22;
  auVar46._28_4_ = iVar22;
  auVar46 = vpmulld_avx2(auVar46,(undefined1  [32])in[0xe]);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar31 + 0x1d0);
  auVar47._4_4_ = uVar1;
  auVar47._0_4_ = uVar1;
  auVar47._8_4_ = uVar1;
  auVar47._12_4_ = uVar1;
  auVar47._16_4_ = uVar1;
  auVar47._20_4_ = uVar1;
  auVar47._24_4_ = uVar1;
  auVar47._28_4_ = uVar1;
  auVar47 = vpmulld_avx2(auVar47,(undefined1  [32])in[0xe]);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar31 + 0x1b0);
  auVar48._4_4_ = uVar1;
  auVar48._0_4_ = uVar1;
  auVar48._8_4_ = uVar1;
  auVar48._12_4_ = uVar1;
  auVar48._16_4_ = uVar1;
  auVar48._20_4_ = uVar1;
  auVar48._24_4_ = uVar1;
  auVar48._28_4_ = uVar1;
  auVar48 = vpmulld_avx2(auVar48,(undefined1  [32])in[10]);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar31 + 0x210);
  auVar49._4_4_ = uVar1;
  auVar49._0_4_ = uVar1;
  auVar49._8_4_ = uVar1;
  auVar49._12_4_ = uVar1;
  auVar49._16_4_ = uVar1;
  auVar49._20_4_ = uVar1;
  auVar49._24_4_ = uVar1;
  auVar49._28_4_ = uVar1;
  auVar49 = vpmulld_avx2(auVar49,(undefined1  [32])in[10]);
  auVar69._4_4_ = iVar21;
  auVar69._0_4_ = iVar21;
  auVar69._8_4_ = iVar21;
  auVar69._12_4_ = iVar21;
  auVar69._16_4_ = iVar21;
  auVar69._20_4_ = iVar21;
  auVar69._24_4_ = iVar21;
  auVar69._28_4_ = iVar21;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar31 + 400);
  auVar51._4_4_ = uVar1;
  auVar51._0_4_ = uVar1;
  auVar51._8_4_ = uVar1;
  auVar51._12_4_ = uVar1;
  auVar51._16_4_ = uVar1;
  auVar51._20_4_ = uVar1;
  auVar51._24_4_ = uVar1;
  auVar51._28_4_ = uVar1;
  auVar58 = vpmulld_avx2(auVar69,(undefined1  [32])in[6]);
  auVar51 = vpmulld_avx2(auVar51,(undefined1  [32])in[6]);
  auVar52._4_4_ = iVar33;
  auVar52._0_4_ = iVar33;
  auVar52._8_4_ = iVar33;
  auVar52._12_4_ = iVar33;
  auVar52._16_4_ = iVar33;
  auVar52._20_4_ = iVar33;
  auVar52._24_4_ = iVar33;
  auVar52._28_4_ = iVar33;
  auVar50 = vpaddd_avx2(auVar50,auVar52);
  auVar55 = vpsrad_avx2(auVar50,ZEXT416((uint)bit));
  auVar50 = vpaddd_avx2(auVar59,auVar52);
  auVar59 = vpsrad_avx2(auVar50,ZEXT416((uint)bit));
  auVar50 = vpaddd_avx2(auVar59,auVar55);
  auVar55 = vpsubd_avx2(auVar55,auVar59);
  auVar59 = vpaddd_avx2(auVar35,auVar52);
  auVar34 = ZEXT416((uint)bit);
  auVar35 = vpsrad_avx2(auVar59,auVar34);
  auVar59 = vpaddd_avx2(auVar36,auVar52);
  auVar36 = vpsrad_avx2(auVar59,auVar34);
  auVar59 = vpaddd_avx2(auVar36,auVar35);
  auVar67 = vpsubd_avx2(auVar36,auVar35);
  auVar35 = vpaddd_avx2(auVar37,auVar52);
  auVar36 = vpsrad_avx2(auVar35,auVar34);
  auVar35 = vpaddd_avx2(auVar38,auVar52);
  auVar37 = vpsrad_avx2(auVar35,auVar34);
  auVar35 = vpaddd_avx2(auVar36,auVar37);
  auVar69 = vpsubd_avx2(auVar36,auVar37);
  auVar36 = vpaddd_avx2(auVar41,auVar52);
  auVar34 = ZEXT416((uint)bit);
  auVar37 = vpsrad_avx2(auVar36,auVar34);
  auVar36 = vpaddd_avx2(auVar42,auVar52);
  auVar38 = vpsrad_avx2(auVar36,auVar34);
  auVar36 = vpaddd_avx2(auVar38,auVar37);
  auVar10 = vpsubd_avx2(auVar38,auVar37);
  auVar37 = vpaddd_avx2(auVar40,auVar52);
  auVar38 = vpsrad_avx2(auVar37,auVar34);
  auVar37 = vpaddd_avx2(auVar43,auVar52);
  auVar40 = vpsrad_avx2(auVar37,auVar34);
  auVar37 = vpaddd_avx2(auVar40,auVar38);
  auVar11 = vpsubd_avx2(auVar40,auVar38);
  auVar53 = vpaddd_avx2(auVar52,auVar53);
  auVar38 = vpsrad_avx2(auVar53,auVar34);
  auVar53 = vpaddd_avx2(auVar52,auVar39);
  auVar39 = vpsrad_avx2(auVar53,auVar34);
  auVar53 = vpaddd_avx2(auVar39,auVar38);
  auVar12 = vpsubd_avx2(auVar38,auVar39);
  auVar56 = vpaddd_avx2(auVar52,auVar56);
  auVar38 = vpsrad_avx2(auVar56,auVar34);
  auVar56 = vpaddd_avx2(auVar52,auVar54);
  auVar54 = vpsrad_avx2(auVar56,auVar34);
  auVar56 = vpaddd_avx2(auVar54,auVar38);
  auVar71 = vpsubd_avx2(auVar54,auVar38);
  auVar9 = vpaddd_avx2(auVar52,auVar9);
  auVar34 = ZEXT416((uint)bit);
  auVar54 = vpsrad_avx2(auVar9,auVar34);
  auVar9 = vpaddd_avx2(auVar52,auVar61);
  auVar61 = vpsrad_avx2(auVar9,auVar34);
  auVar9 = vpaddd_avx2(auVar61,auVar54);
  auVar42 = vpsubd_avx2(auVar54,auVar61);
  auVar61 = vpaddd_avx2(auVar52,auVar45);
  auVar54 = vpsrad_avx2(auVar61,auVar34);
  auVar61 = vpaddd_avx2(auVar46,auVar52);
  auVar38 = vpsrad_avx2(auVar61,auVar34);
  auVar61 = vpaddd_avx2(auVar38,auVar54);
  auVar13 = vpsubd_avx2(auVar54,auVar38);
  auVar54 = vpaddd_avx2(auVar52,auVar49);
  auVar38 = vpsrad_avx2(auVar54,auVar34);
  auVar54 = vpaddd_avx2(auVar52,auVar58);
  auVar39 = vpsrad_avx2(auVar54,auVar34);
  auVar54 = vpaddd_avx2(auVar39,auVar38);
  auVar14 = vpsubd_avx2(auVar39,auVar38);
  auVar38 = vpaddd_avx2(auVar52,auVar48);
  auVar39 = vpsrad_avx2(auVar38,auVar34);
  auVar38 = vpaddd_avx2(auVar52,auVar51);
  auVar40 = vpsrad_avx2(auVar38,auVar34);
  auVar38 = vpaddd_avx2(auVar40,auVar39);
  auVar15 = vpsubd_avx2(auVar40,auVar39);
  auVar39 = vpaddd_avx2(auVar52,auVar44);
  auVar40 = vpsrad_avx2(auVar39,auVar34);
  auVar39 = vpaddd_avx2(auVar52,auVar47);
  auVar41 = vpsrad_avx2(auVar39,auVar34);
  auVar39 = vpaddd_avx2(auVar41,auVar40);
  auVar16 = vpsubd_avx2(auVar40,auVar41);
  auVar62._4_4_ = iVar2;
  auVar62._0_4_ = iVar2;
  auVar62._8_4_ = iVar2;
  auVar62._12_4_ = iVar2;
  auVar62._16_4_ = iVar2;
  auVar62._20_4_ = iVar2;
  auVar62._24_4_ = iVar2;
  auVar62._28_4_ = iVar2;
  auVar64._4_4_ = iVar23;
  auVar64._0_4_ = iVar23;
  auVar64._8_4_ = iVar23;
  auVar64._12_4_ = iVar23;
  auVar64._16_4_ = iVar23;
  auVar64._20_4_ = iVar23;
  auVar64._24_4_ = iVar23;
  auVar64._28_4_ = iVar23;
  auVar40 = vpmaxsd_avx2(auVar55,(undefined1  [32])local_4a0);
  auVar41 = vpminsd_avx2(auVar40,(undefined1  [32])local_480);
  auVar40 = vpmaxsd_avx2(auVar42,(undefined1  [32])local_4a0);
  auVar42 = vpminsd_avx2(auVar40,(undefined1  [32])local_480);
  auVar40 = vpmulld_avx2(auVar42,auVar62);
  auVar40 = vpaddd_avx2(auVar52,auVar40);
  auVar43 = vpmulld_avx2(auVar41,auVar64);
  auVar40 = vpaddd_avx2(auVar43,auVar40);
  auVar70._4_4_ = iVar5;
  auVar70._0_4_ = iVar5;
  auVar70._8_4_ = iVar5;
  auVar70._12_4_ = iVar5;
  auVar70._16_4_ = iVar5;
  auVar70._20_4_ = iVar5;
  auVar70._24_4_ = iVar5;
  auVar70._28_4_ = iVar5;
  auVar43 = vpmulld_avx2(auVar41,auVar62);
  auVar41 = vpmulld_avx2(auVar42,auVar70);
  auVar41 = vpaddd_avx2(auVar41,auVar52);
  auVar41 = vpaddd_avx2(auVar43,auVar41);
  auVar66._4_4_ = iVar32;
  auVar66._0_4_ = iVar32;
  auVar66._8_4_ = iVar32;
  auVar66._12_4_ = iVar32;
  auVar66._16_4_ = iVar32;
  auVar66._20_4_ = iVar32;
  auVar66._24_4_ = iVar32;
  auVar66._28_4_ = iVar32;
  auVar42 = vpmaxsd_avx2(auVar67,(undefined1  [32])local_4a0);
  auVar43 = vpminsd_avx2(auVar42,(undefined1  [32])local_480);
  auVar42 = vpmaxsd_avx2(auVar71,(undefined1  [32])local_4a0);
  auVar44 = vpminsd_avx2(auVar42,(undefined1  [32])local_480);
  auVar45 = vpmulld_avx2(auVar43,auVar66);
  auVar42 = vpmulld_avx2(auVar44,auVar64);
  auVar42 = vpaddd_avx2(auVar42,auVar52);
  auVar42 = vpaddd_avx2(auVar42,auVar45);
  auVar45 = vpmulld_avx2(auVar43,auVar64);
  auVar49 = vpmulld_avx2(auVar70,(undefined1  [32])in[4]);
  auVar58 = vpmulld_avx2(auVar62,(undefined1  [32])in[4]);
  auVar43 = vpmulld_avx2(auVar44,auVar62);
  auVar43 = vpaddd_avx2(auVar43,auVar52);
  auVar43 = vpaddd_avx2(auVar45,auVar43);
  auVar71._4_4_ = iVar3;
  auVar71._0_4_ = iVar3;
  auVar71._8_4_ = iVar3;
  auVar71._12_4_ = iVar3;
  auVar71._16_4_ = iVar3;
  auVar71._20_4_ = iVar3;
  auVar71._24_4_ = iVar3;
  auVar71._28_4_ = iVar3;
  auVar73._4_4_ = iVar29;
  auVar73._0_4_ = iVar29;
  auVar73._8_4_ = iVar29;
  auVar73._12_4_ = iVar29;
  auVar73._16_4_ = iVar29;
  auVar73._20_4_ = iVar29;
  auVar73._24_4_ = iVar29;
  auVar73._28_4_ = iVar29;
  auVar44 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar69);
  auVar45 = vpminsd_avx2(auVar44,(undefined1  [32])local_480);
  auVar44 = vpmaxsd_avx2(auVar12,(undefined1  [32])local_4a0);
  auVar46 = vpminsd_avx2(auVar44,(undefined1  [32])local_480);
  auVar44 = vpmulld_avx2(auVar46,auVar71);
  auVar44 = vpaddd_avx2(auVar44,auVar52);
  auVar47 = vpmulld_avx2(auVar45,auVar73);
  auVar44 = vpaddd_avx2(auVar47,auVar44);
  auVar67._4_4_ = iVar4;
  auVar67._0_4_ = iVar4;
  auVar67._8_4_ = iVar4;
  auVar67._12_4_ = iVar4;
  auVar67._16_4_ = iVar4;
  auVar67._20_4_ = iVar4;
  auVar67._24_4_ = iVar4;
  auVar67._28_4_ = iVar4;
  auVar46 = vpmulld_avx2(auVar46,auVar67);
  auVar47 = vpmulld_avx2(auVar45,auVar71);
  auVar45 = vpaddd_avx2(auVar52,auVar46);
  auVar45 = vpaddd_avx2(auVar47,auVar45);
  auVar55._4_4_ = iVar24;
  auVar55._0_4_ = iVar24;
  auVar55._8_4_ = iVar24;
  auVar55._12_4_ = iVar24;
  auVar55._16_4_ = iVar24;
  auVar55._20_4_ = iVar24;
  auVar55._24_4_ = iVar24;
  auVar55._28_4_ = iVar24;
  auVar46 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar10);
  auVar47 = vpminsd_avx2(auVar46,(undefined1  [32])local_480);
  auVar46 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar11);
  auVar48 = vpminsd_avx2(auVar46,(undefined1  [32])local_480);
  auVar51 = vpmulld_avx2(auVar47,auVar55);
  auVar46 = vpmulld_avx2(auVar48,auVar73);
  auVar46 = vpaddd_avx2(auVar46,auVar52);
  auVar46 = vpaddd_avx2(auVar46,auVar51);
  auVar51 = vpmulld_avx2(auVar47,auVar73);
  auVar55 = vpmulld_avx2(auVar73,(undefined1  [32])in[0xc]);
  auVar67 = vpmulld_avx2(auVar71,(undefined1  [32])in[0xc]);
  auVar48 = vpmulld_avx2(auVar48,auVar71);
  auVar47 = vpaddd_avx2(auVar49,auVar52);
  auVar69 = vpsrad_avx2(auVar47,auVar34);
  auVar47 = vpaddd_avx2(auVar58,auVar52);
  auVar49 = vpsrad_avx2(auVar47,auVar34);
  auVar47 = vpaddd_avx2(auVar48,auVar52);
  auVar47 = vpaddd_avx2(auVar51,auVar47);
  auVar48 = vpaddd_avx2(auVar55,auVar52);
  auVar58 = vpsrad_avx2(auVar48,auVar34);
  auVar48 = vpaddd_avx2(auVar52,auVar67);
  auVar51 = vpsrad_avx2(auVar48,auVar34);
  auVar48 = vpaddd_avx2(auVar58,auVar49);
  auVar11 = vpsubd_avx2(auVar49,auVar58);
  auVar49 = vpaddd_avx2(auVar69,auVar51);
  auVar12 = vpsubd_avx2(auVar69,auVar51);
  auVar57._4_4_ = iVar7;
  auVar57._0_4_ = iVar7;
  auVar57._8_4_ = iVar7;
  auVar57._12_4_ = iVar7;
  auVar57._16_4_ = iVar7;
  auVar57._20_4_ = iVar7;
  auVar57._24_4_ = iVar7;
  auVar57._28_4_ = iVar7;
  auVar68._4_4_ = iVar27;
  auVar68._0_4_ = iVar27;
  auVar68._8_4_ = iVar27;
  auVar68._12_4_ = iVar27;
  auVar68._16_4_ = iVar27;
  auVar68._20_4_ = iVar27;
  auVar68._24_4_ = iVar27;
  auVar68._28_4_ = iVar27;
  auVar58 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar13);
  auVar51 = vpminsd_avx2(auVar58,(undefined1  [32])local_480);
  auVar58 = vpmaxsd_avx2(auVar16,(undefined1  [32])local_4a0);
  auVar55 = vpminsd_avx2(auVar58,(undefined1  [32])local_480);
  auVar58 = vpmulld_avx2(auVar55,auVar57);
  auVar58 = vpaddd_avx2(auVar52,auVar58);
  auVar67 = vpmulld_avx2(auVar51,auVar68);
  auVar58 = vpaddd_avx2(auVar67,auVar58);
  auVar60._4_4_ = iVar8;
  auVar60._0_4_ = iVar8;
  auVar60._8_4_ = iVar8;
  auVar60._12_4_ = iVar8;
  auVar60._16_4_ = iVar8;
  auVar60._20_4_ = iVar8;
  auVar60._24_4_ = iVar8;
  auVar60._28_4_ = iVar8;
  auVar67 = vpmulld_avx2(auVar51,auVar57);
  auVar51 = vpmulld_avx2(auVar55,auVar60);
  auVar51 = vpaddd_avx2(auVar52,auVar51);
  auVar51 = vpaddd_avx2(auVar67,auVar51);
  auVar65._4_4_ = iVar26;
  auVar65._0_4_ = iVar26;
  auVar65._8_4_ = iVar26;
  auVar65._12_4_ = iVar26;
  auVar65._16_4_ = iVar26;
  auVar65._20_4_ = iVar26;
  auVar65._24_4_ = iVar26;
  auVar65._28_4_ = iVar26;
  auVar55 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar14);
  auVar67 = vpminsd_avx2(auVar55,(undefined1  [32])local_480);
  auVar55 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar15);
  auVar69 = vpminsd_avx2(auVar55,(undefined1  [32])local_480);
  auVar55 = vpmulld_avx2(auVar69,auVar68);
  auVar55 = vpaddd_avx2(auVar55,auVar52);
  auVar10 = vpmulld_avx2(auVar67,auVar65);
  auVar55 = vpaddd_avx2(auVar10,auVar55);
  auVar10 = vpmulld_avx2(auVar67,auVar68);
  auVar67 = vpmulld_avx2(auVar69,auVar57);
  auVar67 = vpaddd_avx2(auVar52,auVar67);
  auVar67 = vpaddd_avx2(auVar10,auVar67);
  auVar50 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar50);
  auVar69 = vpminsd_avx2(auVar50,(undefined1  [32])local_480);
  auVar50 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar59);
  auVar59 = vpminsd_avx2(auVar50,(undefined1  [32])local_480);
  auVar40 = vpsrad_avx2(auVar40,auVar34);
  auVar50 = vpaddd_avx2(auVar59,auVar69);
  auVar69 = vpsubd_avx2(auVar69,auVar59);
  auVar42 = vpsrad_avx2(auVar42,auVar34);
  auVar59 = vpaddd_avx2(auVar42,auVar40);
  auVar10 = vpsubd_avx2(auVar40,auVar42);
  auVar35 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar35);
  auVar40 = vpminsd_avx2(auVar35,(undefined1  [32])local_480);
  auVar35 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar36);
  auVar36 = vpminsd_avx2(auVar35,(undefined1  [32])local_480);
  auVar42 = vpsrad_avx2(auVar44,auVar34);
  auVar35 = vpaddd_avx2(auVar36,auVar40);
  auVar71 = vpsubd_avx2(auVar36,auVar40);
  auVar40 = vpsrad_avx2(auVar46,auVar34);
  auVar36 = vpaddd_avx2(auVar40,auVar42);
  auVar13 = vpsubd_avx2(auVar40,auVar42);
  auVar37 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar37);
  auVar40 = vpminsd_avx2(auVar37,(undefined1  [32])local_480);
  auVar37 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar53);
  auVar53 = vpminsd_avx2(auVar37,(undefined1  [32])local_480);
  auVar42 = vpsrad_avx2(auVar45,auVar34);
  auVar37 = vpaddd_avx2(auVar40,auVar53);
  auVar14 = vpsubd_avx2(auVar40,auVar53);
  auVar40 = vpsrad_avx2(auVar47,auVar34);
  auVar53 = vpaddd_avx2(auVar40,auVar42);
  auVar15 = vpsubd_avx2(auVar40,auVar42);
  auVar56 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar56);
  auVar40 = vpminsd_avx2(auVar56,(undefined1  [32])local_480);
  auVar56 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar9);
  auVar9 = vpminsd_avx2(auVar56,(undefined1  [32])local_480);
  auVar41 = vpsrad_avx2(auVar41,auVar34);
  auVar56 = vpaddd_avx2(auVar40,auVar9);
  auVar16 = vpsubd_avx2(auVar9,auVar40);
  auVar40 = vpsrad_avx2(auVar43,auVar34);
  auVar9 = vpaddd_avx2(auVar40,auVar41);
  auVar47 = vpsubd_avx2(auVar41,auVar40);
  auVar72._4_4_ = iVar6;
  auVar72._0_4_ = iVar6;
  auVar72._8_4_ = iVar6;
  auVar72._12_4_ = iVar6;
  auVar72._16_4_ = iVar6;
  auVar72._20_4_ = iVar6;
  auVar72._24_4_ = iVar6;
  auVar72._28_4_ = iVar6;
  auVar40 = vpmulld_avx2(auVar72,(undefined1  [32])*in);
  auVar40 = vpaddd_avx2(auVar40,auVar52);
  auVar42 = vpsrad_avx2(auVar40,auVar34);
  auVar40 = vpmulld_avx2(auVar60,(undefined1  [32])in[8]);
  auVar40 = vpaddd_avx2(auVar40,auVar52);
  auVar41 = vpsrad_avx2(auVar40,auVar34);
  auVar40 = vpmulld_avx2(auVar57,(undefined1  [32])in[8]);
  auVar40 = vpaddd_avx2(auVar40,auVar52);
  auVar43 = vpsrad_avx2(auVar40,auVar34);
  auVar40 = vpaddd_avx2(auVar41,auVar42);
  auVar62 = vpsubd_avx2(auVar42,auVar41);
  auVar41 = vpaddd_avx2(auVar43,auVar42);
  auVar64 = vpsubd_avx2(auVar42,auVar43);
  auVar63._4_4_ = iVar25;
  auVar63._0_4_ = iVar25;
  auVar63._8_4_ = iVar25;
  auVar63._12_4_ = iVar25;
  auVar63._16_4_ = iVar25;
  auVar63._20_4_ = iVar25;
  auVar63._24_4_ = iVar25;
  auVar63._28_4_ = iVar25;
  auVar42 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar11);
  auVar43 = vpminsd_avx2(auVar42,(undefined1  [32])local_480);
  auVar42 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar12);
  auVar44 = vpminsd_avx2(auVar42,(undefined1  [32])local_480);
  auVar42 = vpmulld_avx2(auVar44,auVar72);
  auVar42 = vpaddd_avx2(auVar42,auVar52);
  auVar45 = vpmulld_avx2(auVar43,auVar63);
  auVar42 = vpaddd_avx2(auVar45,auVar42);
  auVar43 = vpaddd_avx2(auVar44,auVar43);
  auVar61 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar61);
  auVar44 = vpminsd_avx2(auVar61,(undefined1  [32])local_480);
  auVar61 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar54);
  auVar45 = vpsrad_avx2(auVar58,auVar34);
  auVar54 = vpminsd_avx2(auVar61,(undefined1  [32])local_480);
  auVar46 = vpsrad_avx2(auVar55,auVar34);
  auVar61 = vpaddd_avx2(auVar54,auVar44);
  auVar11 = vpsubd_avx2(auVar44,auVar54);
  auVar54 = vpaddd_avx2(auVar46,auVar45);
  auVar12 = vpsubd_avx2(auVar45,auVar46);
  auVar38 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar38);
  auVar44 = vpminsd_avx2(auVar38,(undefined1  [32])local_480);
  auVar38 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar39);
  auVar45 = vpsrad_avx2(auVar51,auVar34);
  auVar39 = vpminsd_avx2(auVar38,(undefined1  [32])local_480);
  auVar46 = vpsrad_avx2(auVar67,auVar34);
  auVar38 = vpaddd_avx2(auVar44,auVar39);
  auVar66 = vpsubd_avx2(auVar39,auVar44);
  auVar39 = vpaddd_avx2(auVar45,auVar46);
  auVar70 = vpsubd_avx2(auVar45,auVar46);
  auVar44 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar10);
  auVar45 = vpminsd_avx2(auVar44,(undefined1  [32])local_480);
  auVar44 = vpmaxsd_avx2(auVar47,(undefined1  [32])local_4a0);
  auVar46 = vpminsd_avx2(auVar44,(undefined1  [32])local_480);
  auVar44 = vpmulld_avx2(auVar45,auVar68);
  auVar44 = vpaddd_avx2(auVar44,auVar52);
  auVar47 = vpmulld_avx2(auVar46,auVar57);
  auVar44 = vpaddd_avx2(auVar47,auVar44);
  auVar45 = vpmulld_avx2(auVar45,auVar57);
  auVar46 = vpmulld_avx2(auVar46,auVar60);
  auVar45 = vpaddd_avx2(auVar45,auVar52);
  auVar45 = vpaddd_avx2(auVar45,auVar46);
  auVar46 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar69);
  auVar47 = vpminsd_avx2(auVar46,(undefined1  [32])local_480);
  auVar46 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar16);
  auVar58 = vpminsd_avx2(auVar46,(undefined1  [32])local_480);
  auVar46 = vpmulld_avx2(auVar58,auVar57);
  auVar46 = vpaddd_avx2(auVar52,auVar46);
  auVar51 = vpmulld_avx2(auVar47,auVar68);
  auVar46 = vpaddd_avx2(auVar51,auVar46);
  auVar58 = vpmulld_avx2(auVar58,auVar60);
  auVar51 = vpmulld_avx2(auVar47,auVar57);
  auVar47 = vpaddd_avx2(auVar52,auVar58);
  auVar47 = vpaddd_avx2(auVar51,auVar47);
  auVar58 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar71);
  auVar51 = vpminsd_avx2(auVar58,(undefined1  [32])local_480);
  auVar58 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar14);
  auVar55 = vpminsd_avx2(auVar58,(undefined1  [32])local_480);
  auVar58 = vpmulld_avx2(auVar55,auVar68);
  auVar58 = vpaddd_avx2(auVar52,auVar58);
  auVar67 = vpmulld_avx2(auVar51,auVar65);
  auVar58 = vpaddd_avx2(auVar67,auVar58);
  auVar67 = vpmulld_avx2(auVar51,auVar68);
  auVar51 = vpmulld_avx2(auVar55,auVar57);
  auVar51 = vpaddd_avx2(auVar52,auVar51);
  auVar51 = vpaddd_avx2(auVar67,auVar51);
  auVar55 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar13);
  auVar67 = vpminsd_avx2(auVar55,(undefined1  [32])local_480);
  auVar55 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar15);
  auVar69 = vpminsd_avx2(auVar55,(undefined1  [32])local_480);
  auVar55 = vpmulld_avx2(auVar67,auVar65);
  auVar55 = vpaddd_avx2(auVar55,auVar52);
  auVar10 = vpmulld_avx2(auVar69,auVar68);
  auVar55 = vpaddd_avx2(auVar10,auVar55);
  auVar67 = vpmulld_avx2(auVar67,auVar68);
  auVar69 = vpmulld_avx2(auVar69,auVar57);
  auVar67 = vpaddd_avx2(auVar67,auVar52);
  auVar67 = vpaddd_avx2(auVar67,auVar69);
  auVar49 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar49);
  auVar49 = vpminsd_avx2(auVar49,(undefined1  [32])local_480);
  auVar40 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar40);
  auVar69 = vpminsd_avx2(auVar40,(undefined1  [32])local_480);
  auVar40 = vpaddd_avx2(auVar69,auVar49);
  auVar71 = vpsubd_avx2(auVar69,auVar49);
  auVar41 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar41);
  auVar49 = vpminsd_avx2(auVar41,(undefined1  [32])local_480);
  auVar41 = vpmulld_avx2(auVar43,auVar72);
  auVar41 = vpaddd_avx2(auVar41,auVar52);
  auVar43 = vpsrad_avx2(auVar41,auVar34);
  auVar41 = vpaddd_avx2(auVar43,auVar49);
  auVar13 = vpsubd_avx2(auVar49,auVar43);
  auVar43 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar64);
  auVar49 = vpsrad_avx2(auVar42,auVar34);
  auVar43 = vpminsd_avx2(auVar43,(undefined1  [32])local_480);
  auVar42 = vpaddd_avx2(auVar49,auVar43);
  auVar14 = vpsubd_avx2(auVar43,auVar49);
  auVar43 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar48);
  auVar48 = vpminsd_avx2(auVar43,(undefined1  [32])local_480);
  auVar43 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar62);
  auVar49 = vpminsd_avx2(auVar43,(undefined1  [32])local_480);
  auVar43 = vpaddd_avx2(auVar49,auVar48);
  auVar15 = vpsubd_avx2(auVar49,auVar48);
  auVar48 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar12);
  auVar49 = vpminsd_avx2(auVar48,(undefined1  [32])local_480);
  auVar48 = vpmaxsd_avx2(auVar70,(undefined1  [32])local_4a0);
  auVar69 = vpminsd_avx2(auVar48,(undefined1  [32])local_480);
  auVar48 = vpmulld_avx2(auVar49,auVar63);
  auVar48 = vpaddd_avx2(auVar48,auVar52);
  auVar10 = vpmulld_avx2(auVar69,auVar72);
  auVar48 = vpaddd_avx2(auVar48,auVar10);
  auVar49 = vpaddd_avx2(auVar69,auVar49);
  auVar69 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar11);
  auVar10 = vpminsd_avx2(auVar69,(undefined1  [32])local_480);
  auVar69 = vpmaxsd_avx2(auVar66,(undefined1  [32])local_4a0);
  auVar11 = vpminsd_avx2(auVar69,(undefined1  [32])local_480);
  auVar69 = vpmulld_avx2(auVar11,auVar72);
  auVar69 = vpaddd_avx2(auVar52,auVar69);
  auVar12 = vpmulld_avx2(auVar10,auVar63);
  auVar69 = vpaddd_avx2(auVar12,auVar69);
  auVar10 = vpaddd_avx2(auVar11,auVar10);
  auVar50 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar50);
  auVar11 = vpminsd_avx2(auVar50,(undefined1  [32])local_480);
  auVar50 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar35);
  auVar35 = vpminsd_avx2(auVar50,(undefined1  [32])local_480);
  auVar50 = vpaddd_avx2(auVar35,auVar11);
  auVar11 = vpsubd_avx2(auVar11,auVar35);
  auVar50 = vpmaxsd_avx2(auVar50,(undefined1  [32])local_4a0);
  local_260 = vpminsd_avx2(auVar50,(undefined1  [32])local_480);
  auVar50 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar59);
  auVar59 = vpminsd_avx2(auVar50,(undefined1  [32])local_480);
  auVar50 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar36);
  auVar35 = vpminsd_avx2(auVar50,(undefined1  [32])local_480);
  auVar50 = vpaddd_avx2(auVar35,auVar59);
  auVar36 = vpsubd_avx2(auVar59,auVar35);
  auVar50 = vpmaxsd_avx2(auVar50,(undefined1  [32])local_4a0);
  local_240 = vpminsd_avx2(auVar50,(undefined1  [32])local_480);
  auVar59 = vpsrad_avx2(auVar44,auVar34);
  auVar35 = vpsrad_avx2(auVar55,auVar34);
  auVar50 = vpaddd_avx2(auVar35,auVar59);
  auVar44 = vpsubd_avx2(auVar59,auVar35);
  auVar59 = vpsrad_avx2(auVar46,auVar34);
  auVar50 = vpmaxsd_avx2(auVar50,(undefined1  [32])local_4a0);
  local_220 = vpminsd_avx2(auVar50,(undefined1  [32])local_480);
  auVar35 = vpsrad_avx2(auVar58,auVar34);
  auVar50 = vpaddd_avx2(auVar35,auVar59);
  auVar46 = vpsubd_avx2(auVar59,auVar35);
  auVar50 = vpmaxsd_avx2(auVar50,(undefined1  [32])local_4a0);
  local_200 = vpminsd_avx2(auVar50,(undefined1  [32])local_480);
  auVar50 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar37);
  auVar59 = vpminsd_avx2(auVar50,(undefined1  [32])local_480);
  auVar50 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar56);
  auVar35 = vpminsd_avx2(auVar50,(undefined1  [32])local_480);
  auVar50 = vpaddd_avx2(auVar59,auVar35);
  auVar56 = vpsubd_avx2(auVar35,auVar59);
  auVar50 = vpmaxsd_avx2(auVar50,(undefined1  [32])local_4a0);
  local_80 = vpminsd_avx2(auVar50,(undefined1  [32])local_480);
  auVar50 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar53);
  auVar59 = vpminsd_avx2(auVar50,(undefined1  [32])local_480);
  auVar50 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar9);
  auVar35 = vpminsd_avx2(auVar50,(undefined1  [32])local_480);
  auVar50 = vpaddd_avx2(auVar59,auVar35);
  auVar9 = vpsubd_avx2(auVar35,auVar59);
  auVar50 = vpmaxsd_avx2(auVar50,(undefined1  [32])local_4a0);
  local_a0 = vpminsd_avx2(auVar50,(undefined1  [32])local_480);
  auVar59 = vpsrad_avx2(auVar45,auVar34);
  auVar35 = vpsrad_avx2(auVar67,auVar34);
  auVar50 = vpaddd_avx2(auVar35,auVar59);
  auVar45 = vpsubd_avx2(auVar59,auVar35);
  auVar59 = vpsrad_avx2(auVar47,auVar34);
  auVar50 = vpmaxsd_avx2(auVar50,(undefined1  [32])local_4a0);
  local_c0 = vpminsd_avx2(auVar50,(undefined1  [32])local_480);
  auVar35 = vpsrad_avx2(auVar51,auVar34);
  auVar50 = vpaddd_avx2(auVar35,auVar59);
  auVar47 = vpsubd_avx2(auVar59,auVar35);
  auVar50 = vpmaxsd_avx2(auVar50,(undefined1  [32])local_4a0);
  local_e0 = vpminsd_avx2(auVar50,(undefined1  [32])local_480);
  auVar50 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar38);
  auVar59 = vpminsd_avx2(auVar50,(undefined1  [32])local_480);
  auVar50 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar40);
  auVar35 = vpminsd_avx2(auVar50,(undefined1  [32])local_480);
  auVar50 = vpaddd_avx2(auVar59,auVar35);
  auVar59 = vpsubd_avx2(auVar35,auVar59);
  auVar50 = vpmaxsd_avx2(auVar50,(undefined1  [32])local_4a0);
  local_460 = (__m256i)vpminsd_avx2(auVar50,(undefined1  [32])local_480);
  auVar50 = vpmaxsd_avx2(auVar59,(undefined1  [32])local_4a0);
  local_280 = vpminsd_avx2(auVar50,(undefined1  [32])local_480);
  auVar50 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar39);
  auVar59 = vpminsd_avx2(auVar50,(undefined1  [32])local_480);
  auVar50 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar41);
  auVar35 = vpminsd_avx2(auVar50,(undefined1  [32])local_480);
  auVar50 = vpaddd_avx2(auVar59,auVar35);
  auVar59 = vpsubd_avx2(auVar35,auVar59);
  auVar50 = vpmaxsd_avx2(auVar50,(undefined1  [32])local_4a0);
  local_440 = vpminsd_avx2(auVar50,(undefined1  [32])local_480);
  auVar50 = vpmaxsd_avx2(auVar59,(undefined1  [32])local_4a0);
  local_2a0 = vpminsd_avx2(auVar50,(undefined1  [32])local_480);
  auVar50 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar42);
  auVar59 = vpminsd_avx2(auVar50,(undefined1  [32])local_480);
  auVar50 = vpmulld_avx2(auVar49,auVar72);
  auVar50 = vpaddd_avx2(auVar50,auVar52);
  auVar35 = vpsrad_avx2(auVar50,auVar34);
  auVar50 = vpaddd_avx2(auVar35,auVar59);
  auVar59 = vpsubd_avx2(auVar59,auVar35);
  auVar50 = vpmaxsd_avx2(auVar50,(undefined1  [32])local_4a0);
  local_420 = vpminsd_avx2(auVar50,(undefined1  [32])local_480);
  auVar50 = vpmaxsd_avx2(auVar59,(undefined1  [32])local_4a0);
  local_2c0 = vpminsd_avx2(auVar50,(undefined1  [32])local_480);
  auVar50 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar43);
  auVar59 = vpminsd_avx2(auVar50,(undefined1  [32])local_480);
  auVar50 = vpmulld_avx2(auVar10,auVar72);
  auVar50 = vpaddd_avx2(auVar50,auVar52);
  auVar35 = vpsrad_avx2(auVar50,auVar34);
  auVar50 = vpaddd_avx2(auVar35,auVar59);
  auVar59 = vpsubd_avx2(auVar59,auVar35);
  auVar50 = vpmaxsd_avx2(auVar50,(undefined1  [32])local_4a0);
  local_400 = vpminsd_avx2(auVar50,(undefined1  [32])local_480);
  auVar50 = vpmaxsd_avx2(auVar59,(undefined1  [32])local_4a0);
  local_2e0 = vpminsd_avx2(auVar50,(undefined1  [32])local_480);
  auVar50 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar15);
  auVar59 = vpminsd_avx2(auVar50,(undefined1  [32])local_480);
  auVar35 = vpsrad_avx2(auVar69,auVar34);
  auVar50 = vpaddd_avx2(auVar35,auVar59);
  auVar59 = vpsubd_avx2(auVar59,auVar35);
  auVar50 = vpmaxsd_avx2(auVar50,(undefined1  [32])local_4a0);
  local_3e0 = vpminsd_avx2(auVar50,(undefined1  [32])local_480);
  auVar50 = vpmaxsd_avx2(auVar59,(undefined1  [32])local_4a0);
  local_300 = vpminsd_avx2(auVar50,(undefined1  [32])local_480);
  auVar50 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar14);
  auVar59 = vpminsd_avx2(auVar50,(undefined1  [32])local_480);
  auVar35 = vpsrad_avx2(auVar48,auVar34);
  auVar50 = vpaddd_avx2(auVar35,auVar59);
  auVar59 = vpsubd_avx2(auVar59,auVar35);
  auVar50 = vpmaxsd_avx2(auVar50,(undefined1  [32])local_4a0);
  local_3c0 = vpminsd_avx2(auVar50,(undefined1  [32])local_480);
  auVar50 = vpmaxsd_avx2(auVar59,(undefined1  [32])local_4a0);
  local_320 = vpminsd_avx2(auVar50,(undefined1  [32])local_480);
  auVar50 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar54);
  auVar59 = vpminsd_avx2(auVar50,(undefined1  [32])local_480);
  auVar50 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar13);
  auVar35 = vpminsd_avx2(auVar50,(undefined1  [32])local_480);
  auVar50 = vpaddd_avx2(auVar59,auVar35);
  auVar59 = vpsubd_avx2(auVar35,auVar59);
  auVar50 = vpmaxsd_avx2(auVar50,(undefined1  [32])local_4a0);
  local_3a0 = vpminsd_avx2(auVar50,(undefined1  [32])local_480);
  auVar50 = vpmaxsd_avx2(auVar59,(undefined1  [32])local_4a0);
  local_340 = vpminsd_avx2(auVar50,(undefined1  [32])local_480);
  auVar50 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar61);
  auVar59 = vpminsd_avx2(auVar50,(undefined1  [32])local_480);
  auVar50 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar71);
  auVar35 = vpminsd_avx2(auVar50,(undefined1  [32])local_480);
  auVar50 = vpaddd_avx2(auVar59,auVar35);
  auVar54 = vpsubd_avx2(auVar35,auVar59);
  auVar59 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar11);
  auVar35 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar36);
  auVar36 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar44);
  auVar37 = vpmaxsd_avx2((undefined1  [32])local_4a0,auVar46);
  auVar53 = vpmaxsd_avx2(auVar56,(undefined1  [32])local_4a0);
  auVar56 = vpmaxsd_avx2(auVar9,(undefined1  [32])local_4a0);
  auVar9 = vpmaxsd_avx2(auVar45,(undefined1  [32])local_4a0);
  auVar61 = vpmaxsd_avx2(auVar47,(undefined1  [32])local_4a0);
  auVar50 = vpmaxsd_avx2(auVar50,(undefined1  [32])local_4a0);
  auVar54 = vpmaxsd_avx2(auVar54,(undefined1  [32])local_4a0);
  auVar38 = vpminsd_avx2(auVar59,(undefined1  [32])local_480);
  auVar35 = vpminsd_avx2(auVar35,(undefined1  [32])local_480);
  auVar36 = vpminsd_avx2(auVar36,(undefined1  [32])local_480);
  auVar59 = vpminsd_avx2(auVar37,(undefined1  [32])local_480);
  auVar37 = vpminsd_avx2(auVar53,(undefined1  [32])local_480);
  auVar53 = vpminsd_avx2(auVar56,(undefined1  [32])local_480);
  auVar56 = vpminsd_avx2(auVar9,(undefined1  [32])local_480);
  auVar9 = vpminsd_avx2(auVar61,(undefined1  [32])local_480);
  local_380 = vpminsd_avx2(auVar50,(undefined1  [32])local_480);
  local_360 = vpminsd_avx2(auVar54,(undefined1  [32])local_480);
  auVar50 = vpmulld_avx2(auVar59,auVar63);
  auVar61 = vpmulld_avx2(auVar9,auVar72);
  auVar50 = vpaddd_avx2(auVar50,auVar52);
  auVar50 = vpaddd_avx2(auVar50,auVar61);
  auVar59 = vpaddd_avx2(auVar9,auVar59);
  local_1e0 = vpsrad_avx2(auVar50,auVar34);
  auVar50 = vpmulld_avx2(auVar59,auVar72);
  auVar50 = vpaddd_avx2(auVar50,auVar52);
  local_100 = vpsrad_avx2(auVar50,auVar34);
  auVar50 = vpmulld_avx2(auVar36,auVar63);
  auVar59 = vpmulld_avx2(auVar56,auVar72);
  auVar50 = vpaddd_avx2(auVar50,auVar52);
  auVar50 = vpaddd_avx2(auVar50,auVar59);
  auVar59 = vpaddd_avx2(auVar56,auVar36);
  local_1c0 = vpsrad_avx2(auVar50,auVar34);
  auVar50 = vpmulld_avx2(auVar59,auVar72);
  auVar50 = vpaddd_avx2(auVar50,auVar52);
  local_120 = vpsrad_avx2(auVar50,auVar34);
  auVar50 = vpmulld_avx2(auVar35,auVar63);
  auVar59 = vpmulld_avx2(auVar53,auVar72);
  auVar50 = vpaddd_avx2(auVar50,auVar52);
  auVar50 = vpaddd_avx2(auVar50,auVar59);
  auVar59 = vpaddd_avx2(auVar53,auVar35);
  auVar59 = vpmulld_avx2(auVar59,auVar72);
  auVar59 = vpaddd_avx2(auVar59,auVar52);
  local_140 = vpsrad_avx2(auVar59,auVar34);
  local_1a0 = vpsrad_avx2(auVar50,auVar34);
  auVar59 = vpmulld_avx2(auVar38,auVar63);
  auVar50 = vpmulld_avx2(auVar37,auVar72);
  auVar50 = vpaddd_avx2(auVar52,auVar50);
  auVar50 = vpaddd_avx2(auVar59,auVar50);
  auVar59 = vpaddd_avx2(auVar38,auVar37);
  auVar59 = vpmulld_avx2(auVar59,auVar72);
  auVar59 = vpaddd_avx2(auVar59,auVar52);
  local_180 = vpsrad_avx2(auVar50,auVar34);
  local_160 = vpsrad_avx2(auVar59,auVar34);
  idct32_stage9_avx2(&local_460,out,do_cols,bd,out_shift,&local_4a0,&local_480);
  return;
}

Assistant:

static void idct32_low16_avx2(__m256i *in, __m256i *out, int bit, int do_cols,
                              int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m256i cospi62 = _mm256_set1_epi32(cospi[62]);
  const __m256i cospi30 = _mm256_set1_epi32(cospi[30]);
  const __m256i cospi46 = _mm256_set1_epi32(cospi[46]);
  const __m256i cospi14 = _mm256_set1_epi32(cospi[14]);
  const __m256i cospi54 = _mm256_set1_epi32(cospi[54]);
  const __m256i cospi22 = _mm256_set1_epi32(cospi[22]);
  const __m256i cospi38 = _mm256_set1_epi32(cospi[38]);
  const __m256i cospi6 = _mm256_set1_epi32(cospi[6]);
  const __m256i cospi26 = _mm256_set1_epi32(cospi[26]);
  const __m256i cospi10 = _mm256_set1_epi32(cospi[10]);
  const __m256i cospi18 = _mm256_set1_epi32(cospi[18]);
  const __m256i cospi2 = _mm256_set1_epi32(cospi[2]);
  const __m256i cospim58 = _mm256_set1_epi32(-cospi[58]);
  const __m256i cospim42 = _mm256_set1_epi32(-cospi[42]);
  const __m256i cospim50 = _mm256_set1_epi32(-cospi[50]);
  const __m256i cospim34 = _mm256_set1_epi32(-cospi[34]);
  const __m256i cospi60 = _mm256_set1_epi32(cospi[60]);
  const __m256i cospi28 = _mm256_set1_epi32(cospi[28]);
  const __m256i cospi44 = _mm256_set1_epi32(cospi[44]);
  const __m256i cospi12 = _mm256_set1_epi32(cospi[12]);
  const __m256i cospi20 = _mm256_set1_epi32(cospi[20]);
  const __m256i cospi4 = _mm256_set1_epi32(cospi[4]);
  const __m256i cospim52 = _mm256_set1_epi32(-cospi[52]);
  const __m256i cospim36 = _mm256_set1_epi32(-cospi[36]);
  const __m256i cospi56 = _mm256_set1_epi32(cospi[56]);
  const __m256i cospi24 = _mm256_set1_epi32(cospi[24]);
  const __m256i cospi40 = _mm256_set1_epi32(cospi[40]);
  const __m256i cospi8 = _mm256_set1_epi32(cospi[8]);
  const __m256i cospim40 = _mm256_set1_epi32(-cospi[40]);
  const __m256i cospim8 = _mm256_set1_epi32(-cospi[8]);
  const __m256i cospim56 = _mm256_set1_epi32(-cospi[56]);
  const __m256i cospim24 = _mm256_set1_epi32(-cospi[24]);
  const __m256i cospi32 = _mm256_set1_epi32(cospi[32]);
  const __m256i cospim32 = _mm256_set1_epi32(-cospi[32]);
  const __m256i cospi48 = _mm256_set1_epi32(cospi[48]);
  const __m256i cospim48 = _mm256_set1_epi32(-cospi[48]);
  const __m256i cospi16 = _mm256_set1_epi32(cospi[16]);
  const __m256i cospim16 = _mm256_set1_epi32(-cospi[16]);
  const __m256i rounding = _mm256_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m256i clamp_lo = _mm256_set1_epi32(-(1 << (log_range - 1)));
  const __m256i clamp_hi = _mm256_set1_epi32((1 << (log_range - 1)) - 1);
  __m256i bf1[32];

  {
    // stage 0
    // stage 1
    bf1[0] = in[0];
    bf1[2] = in[8];
    bf1[4] = in[4];
    bf1[6] = in[12];
    bf1[8] = in[2];
    bf1[10] = in[10];
    bf1[12] = in[6];
    bf1[14] = in[14];
    bf1[16] = in[1];
    bf1[18] = in[9];
    bf1[20] = in[5];
    bf1[22] = in[13];
    bf1[24] = in[3];
    bf1[26] = in[11];
    bf1[28] = in[7];
    bf1[30] = in[15];

    // stage 2
    bf1[31] = half_btf_0_avx2(&cospi2, &bf1[16], &rounding, bit);
    bf1[16] = half_btf_0_avx2(&cospi62, &bf1[16], &rounding, bit);
    bf1[17] = half_btf_0_avx2(&cospim34, &bf1[30], &rounding, bit);
    bf1[30] = half_btf_0_avx2(&cospi30, &bf1[30], &rounding, bit);
    bf1[29] = half_btf_0_avx2(&cospi18, &bf1[18], &rounding, bit);
    bf1[18] = half_btf_0_avx2(&cospi46, &bf1[18], &rounding, bit);
    bf1[19] = half_btf_0_avx2(&cospim50, &bf1[28], &rounding, bit);
    bf1[28] = half_btf_0_avx2(&cospi14, &bf1[28], &rounding, bit);
    bf1[27] = half_btf_0_avx2(&cospi10, &bf1[20], &rounding, bit);
    bf1[20] = half_btf_0_avx2(&cospi54, &bf1[20], &rounding, bit);
    bf1[21] = half_btf_0_avx2(&cospim42, &bf1[26], &rounding, bit);
    bf1[26] = half_btf_0_avx2(&cospi22, &bf1[26], &rounding, bit);
    bf1[25] = half_btf_0_avx2(&cospi26, &bf1[22], &rounding, bit);
    bf1[22] = half_btf_0_avx2(&cospi38, &bf1[22], &rounding, bit);
    bf1[23] = half_btf_0_avx2(&cospim58, &bf1[24], &rounding, bit);
    bf1[24] = half_btf_0_avx2(&cospi6, &bf1[24], &rounding, bit);

    // stage 3
    bf1[15] = half_btf_0_avx2(&cospi4, &bf1[8], &rounding, bit);
    bf1[8] = half_btf_0_avx2(&cospi60, &bf1[8], &rounding, bit);
    bf1[9] = half_btf_0_avx2(&cospim36, &bf1[14], &rounding, bit);
    bf1[14] = half_btf_0_avx2(&cospi28, &bf1[14], &rounding, bit);
    bf1[13] = half_btf_0_avx2(&cospi20, &bf1[10], &rounding, bit);
    bf1[10] = half_btf_0_avx2(&cospi44, &bf1[10], &rounding, bit);
    bf1[11] = half_btf_0_avx2(&cospim52, &bf1[12], &rounding, bit);
    bf1[12] = half_btf_0_avx2(&cospi12, &bf1[12], &rounding, bit);

    addsub_avx2(bf1[16], bf1[17], bf1 + 16, bf1 + 17, &clamp_lo, &clamp_hi);
    addsub_avx2(bf1[19], bf1[18], bf1 + 19, bf1 + 18, &clamp_lo, &clamp_hi);
    addsub_avx2(bf1[20], bf1[21], bf1 + 20, bf1 + 21, &clamp_lo, &clamp_hi);
    addsub_avx2(bf1[23], bf1[22], bf1 + 23, bf1 + 22, &clamp_lo, &clamp_hi);
    addsub_avx2(bf1[24], bf1[25], bf1 + 24, bf1 + 25, &clamp_lo, &clamp_hi);
    addsub_avx2(bf1[27], bf1[26], bf1 + 27, bf1 + 26, &clamp_lo, &clamp_hi);
    addsub_avx2(bf1[28], bf1[29], bf1 + 28, bf1 + 29, &clamp_lo, &clamp_hi);
    addsub_avx2(bf1[31], bf1[30], bf1 + 31, bf1 + 30, &clamp_lo, &clamp_hi);

    // stage 4
    bf1[7] = half_btf_0_avx2(&cospi8, &bf1[4], &rounding, bit);
    bf1[4] = half_btf_0_avx2(&cospi56, &bf1[4], &rounding, bit);
    bf1[5] = half_btf_0_avx2(&cospim40, &bf1[6], &rounding, bit);
    bf1[6] = half_btf_0_avx2(&cospi24, &bf1[6], &rounding, bit);

    addsub_avx2(bf1[8], bf1[9], bf1 + 8, bf1 + 9, &clamp_lo, &clamp_hi);
    addsub_avx2(bf1[11], bf1[10], bf1 + 11, bf1 + 10, &clamp_lo, &clamp_hi);
    addsub_avx2(bf1[12], bf1[13], bf1 + 12, bf1 + 13, &clamp_lo, &clamp_hi);
    addsub_avx2(bf1[15], bf1[14], bf1 + 15, bf1 + 14, &clamp_lo, &clamp_hi);

    idct32_stage4_avx2(bf1, &cospim8, &cospi56, &cospi8, &cospim56, &cospim40,
                       &cospi24, &cospi40, &cospim24, &rounding, bit);

    // stage 5
    bf1[0] = half_btf_0_avx2(&cospi32, &bf1[0], &rounding, bit);
    bf1[1] = bf1[0];
    bf1[3] = half_btf_0_avx2(&cospi16, &bf1[2], &rounding, bit);
    bf1[2] = half_btf_0_avx2(&cospi48, &bf1[2], &rounding, bit);

    addsub_avx2(bf1[4], bf1[5], bf1 + 4, bf1 + 5, &clamp_lo, &clamp_hi);
    addsub_avx2(bf1[7], bf1[6], bf1 + 7, bf1 + 6, &clamp_lo, &clamp_hi);

    idct32_stage5_avx2(bf1, &cospim16, &cospi48, &cospi16, &cospim48, &clamp_lo,
                       &clamp_hi, &rounding, bit);

    // stage 6
    addsub_avx2(bf1[0], bf1[3], bf1 + 0, bf1 + 3, &clamp_lo, &clamp_hi);
    addsub_avx2(bf1[1], bf1[2], bf1 + 1, bf1 + 2, &clamp_lo, &clamp_hi);

    idct32_stage6_avx2(bf1, &cospim32, &cospi32, &cospim16, &cospi48, &cospi16,
                       &cospim48, &clamp_lo, &clamp_hi, &rounding, bit);

    // stage 7
    idct32_stage7_avx2(bf1, &cospim32, &cospi32, &clamp_lo, &clamp_hi,
                       &rounding, bit);

    // stage 8
    idct32_stage8_avx2(bf1, &cospim32, &cospi32, &clamp_lo, &clamp_hi,
                       &rounding, bit);

    // stage 9
    idct32_stage9_avx2(bf1, out, do_cols, bd, out_shift, &clamp_lo, &clamp_hi);
  }
}